

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HD44780AnalyzerSettings.cpp
# Opt level: O1

char * __thiscall HD44780AnalyzerSettings::SaveSettings(HD44780AnalyzerSettings *this)

{
  char *pcVar1;
  long lVar2;
  SimpleArchive text_archive;
  SimpleArchive local_20 [8];
  
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::operator<<(local_20,"SaleaeHD44780Analyzer");
  SimpleArchive::operator<<(local_20,1);
  SimpleArchive::operator<<(local_20,&this->mEChannel);
  SimpleArchive::operator<<(local_20,&this->mRSChannel);
  SimpleArchive::operator<<(local_20,&this->mRWChannel);
  lVar2 = 0x40;
  do {
    SimpleArchive::operator<<(local_20,(Channel *)(&this->super_AnalyzerSettings + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xc0);
  SimpleArchive::operator<<(local_20,this->mMarkTimingErrors);
  SimpleArchive::operator<<(local_20,this->mEnableCycleMin);
  SimpleArchive::operator<<(local_20,this->mEnablePulseWidthMin);
  SimpleArchive::operator<<(local_20,this->mAddressSetupMin);
  SimpleArchive::operator<<(local_20,this->mAddressHoldMin);
  SimpleArchive::operator<<(local_20,this->mDataWriteSetupMin);
  SimpleArchive::operator<<(local_20,this->mDataWriteHoldMin);
  SimpleArchive::operator<<(local_20,this->mDataReadDelayMax);
  SimpleArchive::operator<<(local_20,this->mDataReadHoldMin);
  SimpleArchive::operator<<(local_20,this->mIgnoreEPulsesWhenBusy);
  SimpleArchive::operator<<(local_20,this->mBusyTimeClearHome);
  SimpleArchive::operator<<(local_20,this->mBusyTimeCmdChar);
  SimpleArchive::operator<<(local_20,this->mStartIn4BitMode);
  SimpleArchive::operator<<(local_20,this->mDoNotGenerateBusyCheckFrames);
  SimpleArchive::GetString();
  pcVar1 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(local_20);
  return pcVar1;
}

Assistant:

const char* HD44780AnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;
    U32 dbline;

    // save settings
    text_archive << ANALYZER_SAVE_NAME;
    text_archive << ANALYZER_SAVE_VERSION;
    text_archive << mEChannel;
    text_archive << mRSChannel;
    text_archive << mRWChannel;
    for( dbline = 0; dbline < 8; dbline++ )
        text_archive << mDBChannel[ dbline ];
    text_archive << mMarkTimingErrors;
    text_archive << mEnableCycleMin;
    text_archive << mEnablePulseWidthMin;
    text_archive << mAddressSetupMin;
    text_archive << mAddressHoldMin;
    text_archive << mDataWriteSetupMin;
    text_archive << mDataWriteHoldMin;
    text_archive << mDataReadDelayMax;
    text_archive << mDataReadHoldMin;
    text_archive << mIgnoreEPulsesWhenBusy;
    text_archive << mBusyTimeClearHome;
    text_archive << mBusyTimeCmdChar;
    text_archive << mStartIn4BitMode;
    text_archive << mDoNotGenerateBusyCheckFrames;

    return SetReturnString( text_archive.GetString() );
}